

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 closest_point_point_obb(vec3 p,vec3 bc,vec3 bx,vec3 by,vec3 bz,float bex,float bey,float bez)

{
  float fVar1;
  float *pfVar2;
  int i;
  long lVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3 vVar11;
  float be [3];
  float local_20;
  undefined8 local_1c;
  float local_14;
  vec3 local_10;
  
  fVar6 = bc.z;
  uVar5 = bc._0_8_;
  pfVar2 = &local_20;
  local_20 = bx.z;
  local_1c = by._0_8_;
  local_14 = by.z;
  local_10.x = bz.x;
  local_10.y = bz.y;
  local_10.z = bz.z;
  be[0] = bex;
  be[1] = bey;
  be[2] = bez;
  fVar4 = p.z - fVar6;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 3) break;
    fVar7 = (float)*(undefined8 *)(pfVar2 + -2);
    fVar8 = (float)((ulong)*(undefined8 *)(pfVar2 + -2) >> 0x20);
    fVar9 = fVar4 * *pfVar2 + (p.x - bc.x) * fVar7 + (p.y - bc.y) * fVar8;
    fVar1 = be[lVar3];
    fVar10 = fVar1;
    if (fVar9 <= fVar1) {
      fVar10 = fVar9;
    }
    fVar9 = -fVar1;
    if (-fVar1 <= fVar10) {
      fVar9 = fVar10;
    }
    uVar5 = CONCAT44((float)((ulong)uVar5 >> 0x20) + fVar9 * fVar8,(float)uVar5 + fVar9 * fVar7);
    fVar6 = fVar6 + *pfVar2 * fVar9;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
  }
  vVar11.z = fVar6;
  vVar11.x = (float)(int)uVar5;
  vVar11.y = (float)(int)((ulong)uVar5 >> 0x20);
  return vVar11;
}

Assistant:

vec3 closest_point_point_obb(vec3 p, vec3 bc, vec3 bx, vec3 by, vec3 bz, float bex, float bey, float bez) {
    vec3 bu[3] = {bx, by, bz};
    float be[3] = {bex, bey, bez};
    vec3 d = vec3_sub(p, bc);    
    vec3 q = bc;
    for (int i = 0; i < 3; i++) {
        float dist = vec3_dot(d, bu[i]);
        if (dist > be[i]) dist = be[i];
        if (dist < -be[i]) dist = -be[i];
        q = vec3_add(q, vec3_scale(bu[i], dist));
    }
    return q;
}